

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O2

void __thiscall
OpenMD::SimpleTypeData<OpenMD::FluctuatingAtypeParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::FluctuatingAtypeParameters> *this)

{
  (this->super_GenericData)._vptr_GenericData = (_func_int **)&PTR__SimpleTypeData_002c53c8;
  std::
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               *)&(this->data_).vself);
  GenericData::~GenericData(&this->super_GenericData);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}